

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RngStream.cpp
# Opt level: O0

double anon_unknown.dwarf_69cc::MultModM(double a,double s,double c,double m)

{
  double dVar1;
  long a1;
  double v;
  double m_local;
  double c_local;
  double s_local;
  double a_local;
  double local_8;
  
  v = a * s + c;
  if ((9007199254740992.0 <= v) || (v <= -9007199254740992.0)) {
    dVar1 = (double)(long)(a / 131072.0) * s;
    v = (-(double)(long)(dVar1 / m) * m + dVar1) * 131072.0 +
        (-(double)(long)(a / 131072.0) * 131072.0 + a) * s + c;
  }
  local_8 = -(double)(long)(v / m) * m + v;
  if (local_8 < 0.0) {
    local_8 = m + local_8;
  }
  return local_8;
}

Assistant:

double MultModM (double a, double s, double c, double m)
{
    double v;
    long a1;

    v = a * s + c;

    if (v >= two53 || v <= -two53) {
        a1 = static_cast<long> (a / two17);    a -= a1 * two17;
        v  = a1 * s;
        a1 = static_cast<long> (v / m);     v -= a1 * m;
        v = v * two17 + a * s + c;
    }

    a1 = static_cast<long> (v / m);
    /* in case v < 0)*/
    if ((v -= a1 * m) < 0.0) return v += m;   else return v;
}